

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filesystem.hpp
# Opt level: O0

path * ghc::filesystem::absolute(path *__return_storage_ptr__,path *p,error_code *ec)

{
  bool bVar1;
  error_code eVar2;
  undefined4 uStack_13c;
  path local_130;
  path local_110;
  path local_f0;
  path local_d0;
  path local_b0;
  path local_90;
  path local_70;
  undefined4 local_50;
  undefined1 local_40 [8];
  path base;
  error_code *ec_local;
  path *p_local;
  
  base._path.field_2._8_8_ = ec;
  std::error_code::clear(ec);
  current_path((path *)local_40,(error_code *)base._path.field_2._8_8_);
  bVar1 = std::error_code::operator_cast_to_bool((error_code *)base._path.field_2._8_8_);
  if (bVar1) {
    eVar2 = detail::make_system_error(0);
    *(ulong *)base._path.field_2._8_8_ = CONCAT44(uStack_13c,eVar2._M_value);
    *(error_category **)(base._path.field_2._8_8_ + 8) = eVar2._M_cat;
    path::path(__return_storage_ptr__);
  }
  else {
    bVar1 = path::empty(p);
    if (bVar1) {
      operator/(__return_storage_ptr__,(path *)local_40,p);
    }
    else {
      bVar1 = path::has_root_name(p);
      if (bVar1) {
        bVar1 = path::has_root_directory(p);
        if (bVar1) {
          path::path(__return_storage_ptr__,p);
        }
        else {
          path::root_name(&local_b0,p);
          path::root_directory(&local_d0,(path *)local_40);
          operator/(&local_90,&local_b0,&local_d0);
          path::relative_path(&local_f0,(path *)local_40);
          operator/(&local_70,&local_90,&local_f0);
          path::relative_path(&local_110,p);
          operator/(__return_storage_ptr__,&local_70,&local_110);
          path::~path(&local_110);
          path::~path(&local_70);
          path::~path(&local_f0);
          path::~path(&local_90);
          path::~path(&local_d0);
          path::~path(&local_b0);
        }
      }
      else {
        bVar1 = path::has_root_directory(p);
        if (bVar1) {
          path::root_name(&local_130,(path *)local_40);
          operator/(__return_storage_ptr__,&local_130,p);
          path::~path(&local_130);
        }
        else {
          operator/(__return_storage_ptr__,(path *)local_40,p);
        }
      }
    }
  }
  local_50 = 1;
  path::~path((path *)local_40);
  return __return_storage_ptr__;
}

Assistant:

GHC_INLINE path absolute(const path& p, std::error_code& ec)
{
    ec.clear();
#ifdef GHC_OS_WINDOWS
    if (p.empty()) {
        return absolute(current_path(ec), ec) / "";
    }
    ULONG size = ::GetFullPathNameW(p.wstring().c_str(), 0, 0, 0);
    if (size) {
        std::vector<wchar_t> buf(size, 0);
        ULONG s2 = GetFullPathNameW(p.wstring().c_str(), size, buf.data(), nullptr);
        if (s2 && s2 < size) {
            path result = path(std::wstring(buf.data(), s2));
            if (p.filename() == ".") {
                result /= ".";
            }
            return result;
        }
    }
    ec = detail::make_system_error();
    return path();
#else
    path base = current_path(ec);
    if (!ec) {
        if (p.empty()) {
            return base / p;
        }
        if (p.has_root_name()) {
            if (p.has_root_directory()) {
                return p;
            }
            else {
                return p.root_name() / base.root_directory() / base.relative_path() / p.relative_path();
            }
        }
        else {
            if (p.has_root_directory()) {
                return base.root_name() / p;
            }
            else {
                return base / p;
            }
        }
    }
    ec = detail::make_system_error();
    return path();
#endif
}